

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableDrawBorders(ImGuiTable *table)

{
  bool bVar1;
  char *pcVar2;
  long in_RDI;
  float fVar3;
  float border_y;
  ImU32 outer_col;
  ImRect outer_border;
  float draw_y2;
  ImU32 col;
  bool is_frozen_separator;
  bool is_resizable;
  bool is_resized;
  bool is_hovered;
  ImGuiTableColumn *column;
  int column_n;
  int order_n;
  float draw_y2_head;
  float draw_y2_body;
  float draw_y1;
  float border_size;
  ImDrawList *inner_drawlist;
  ImGuiWindow *inner_window;
  ImDrawList *in_stack_fffffffffffffef0;
  undefined8 in_stack_ffffffffffffff00;
  ImGuiCol idx;
  ImDrawList *in_stack_ffffffffffffff08;
  ImDrawList *in_stack_ffffffffffffff10;
  ImVec2 in_stack_ffffffffffffff18;
  ImVec2 in_stack_ffffffffffffff20;
  ImU32 local_cc;
  float in_stack_ffffffffffffff38;
  ImU32 in_stack_ffffffffffffff3c;
  ImU32 in_stack_ffffffffffffff40;
  undefined2 in_stack_ffffffffffffff44;
  undefined1 in_stack_ffffffffffffff46;
  undefined1 in_stack_ffffffffffffff47;
  float in_stack_ffffffffffffff4c;
  float in_stack_ffffffffffffff50;
  float in_stack_ffffffffffffff54;
  ImVec2 local_a4;
  float local_9c;
  ImVec2 local_98;
  float in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  float in_stack_ffffffffffffff78;
  float in_stack_ffffffffffffff7c;
  ImVec2 in_stack_ffffffffffffff80;
  float _x;
  float _y;
  float _x_00;
  float fStack_68;
  ImVec2 local_64;
  ImVec2 local_5c;
  float local_54;
  ImU32 local_50;
  undefined1 local_4c;
  undefined1 local_4b;
  undefined1 local_4a;
  undefined1 local_49;
  ImGuiTableColumn *local_48;
  int local_40;
  int local_3c;
  float local_38;
  float local_34;
  float local_30;
  undefined4 local_2c;
  undefined8 local_28;
  undefined8 local_20;
  ImDrawList *local_18;
  long local_10;
  long local_8;
  
  local_10 = *(long *)(in_RDI + 0x1d0);
  local_8 = in_RDI;
  bVar1 = ImRect::Overlaps((ImRect *)(*(long *)(in_RDI + 0x1c8) + 600),(ImRect *)(in_RDI + 0xec));
  if (bVar1) {
    local_18 = *(ImDrawList **)(local_10 + 0x2b8);
    ImDrawListSplitter::SetCurrentChannel
              ((ImDrawListSplitter *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
               (int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
    local_20 = *(undefined8 *)(local_8 + 0x13c);
    local_28 = *(undefined8 *)(local_8 + 0x144);
    ImDrawList::PushClipRect
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
               SUB81((ulong)in_stack_ffffffffffffff08 >> 0x38,0));
    local_2c = 0x3f800000;
    fVar3 = *(float *)(local_8 + 0x100);
    local_34 = *(float *)(local_8 + 0x108);
    local_30 = fVar3;
    if ((*(byte *)(local_8 + 0x24c) & 1) != 0) {
      in_stack_ffffffffffffff50 = *(float *)(local_8 + 0x108);
      if (*(char *)(local_8 + 0x241) < '\x01') {
        in_stack_ffffffffffffff4c = *(float *)(local_8 + 0x110);
      }
      else {
        in_stack_ffffffffffffff4c = *(float *)(local_8 + 0x100);
      }
      fVar3 = ImMin<float>(in_stack_ffffffffffffff50,
                           in_stack_ffffffffffffff4c + *(float *)(local_8 + 0xd0));
    }
    local_38 = fVar3;
    if ((*(uint *)(local_8 + 4) & 0x200) != 0) {
      for (local_3c = 0; local_3c < *(int *)(local_8 + 0x6c); local_3c = local_3c + 1) {
        if ((*(ulong *)(local_8 + 0x40) & 1L << ((byte)local_3c & 0x3f)) != 0) {
          pcVar2 = ImSpan<signed_char>::operator[]((ImSpan<signed_char> *)(local_8 + 0x20),local_3c)
          ;
          local_40 = (int)*pcVar2;
          local_48 = ImSpan<ImGuiTableColumn>::operator[]
                               ((ImSpan<ImGuiTableColumn> *)(local_8 + 0x10),local_40);
          local_49 = *(char *)(local_8 + 0x235) == local_40;
          in_stack_ffffffffffffff47 = false;
          if (*(char *)(local_8 + 0x237) == local_40) {
            in_stack_ffffffffffffff47 = *(short *)(local_8 + 0x7a) == *(short *)(local_8 + 0x78);
          }
          local_4b = (local_48->Flags & 0x40000010U) == 0;
          in_stack_ffffffffffffff46 = false;
          if (*(char *)(local_8 + 0x243) != -1) {
            in_stack_ffffffffffffff46 = (int)*(char *)(local_8 + 0x243) == local_3c + 1;
          }
          local_4c = in_stack_ffffffffffffff46;
          local_4a = in_stack_ffffffffffffff47;
          if ((((local_48->MaxX < *(float *)(local_8 + 0x124) ||
                 local_48->MaxX == *(float *)(local_8 + 0x124)) ||
               ((bool)in_stack_ffffffffffffff47 != false)) &&
              (((local_48->NextEnabledColumn != -1 || ((bool)local_4b)) ||
               (((*(uint *)(local_8 + 4) & 0xe000) == 0x4000 &&
                ((*(uint *)(local_8 + 4) & 0x10000) == 0)))))) &&
             ((local_48->ClipRect).Min.x < local_48->MaxX)) {
            if ((((bool)local_49) || ((bool)in_stack_ffffffffffffff47 != false)) ||
               ((bool)in_stack_ffffffffffffff46 != false)) {
              local_54 = local_34;
              idx = (ImGuiCol)((ulong)in_stack_ffffffffffffff00 >> 0x20);
              if ((bool)in_stack_ffffffffffffff47 == false) {
                if ((bool)local_49) {
                  in_stack_ffffffffffffff3c = GetColorU32(idx,(float)in_stack_ffffffffffffff00);
                  in_stack_ffffffffffffff40 = in_stack_ffffffffffffff3c;
                  local_50 = in_stack_ffffffffffffff3c;
                }
                else {
                  in_stack_ffffffffffffff3c = *(ImU32 *)(local_8 + 0xa0);
                  in_stack_ffffffffffffff40 = in_stack_ffffffffffffff3c;
                  local_50 = in_stack_ffffffffffffff3c;
                }
              }
              else {
                local_50 = GetColorU32(idx,(float)in_stack_ffffffffffffff00);
                in_stack_ffffffffffffff40 = local_50;
              }
            }
            else {
              in_stack_ffffffffffffff38 = local_34;
              if ((*(uint *)(local_8 + 4) & 0x1800) != 0) {
                in_stack_ffffffffffffff38 = local_38;
              }
              if ((*(uint *)(local_8 + 4) & 0x1800) == 0) {
                local_cc = *(ImU32 *)(local_8 + 0xa4);
              }
              else {
                local_cc = *(ImU32 *)(local_8 + 0xa0);
              }
              local_50 = local_cc;
              local_54 = in_stack_ffffffffffffff38;
            }
            if (local_30 < local_54) {
              ImVec2::ImVec2(&local_5c,local_48->MaxX,local_30);
              ImVec2::ImVec2(&local_64,local_48->MaxX,local_54);
              ImDrawList::AddLine((ImDrawList *)
                                  CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                                  (ImVec2 *)CONCAT44(in_stack_ffffffffffffff4c,fVar3),
                                  (ImVec2 *)
                                  CONCAT17(in_stack_ffffffffffffff47,
                                           CONCAT16(in_stack_ffffffffffffff46,
                                                    CONCAT24(in_stack_ffffffffffffff44,
                                                             in_stack_ffffffffffffff40))),
                                  in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
            }
          }
        }
      }
    }
    if ((*(uint *)(local_8 + 4) & 0x500) != 0) {
      _x = (float)*(undefined8 *)(local_8 + 0xec);
      _y = (float)((ulong)*(undefined8 *)(local_8 + 0xec) >> 0x20);
      _x_00 = (float)*(undefined8 *)(local_8 + 0xf4);
      fStack_68 = (float)((ulong)*(undefined8 *)(local_8 + 0xf4) >> 0x20);
      if ((*(uint *)(local_8 + 4) & 0x500) == 0x500) {
        ImDrawList::AddRect((ImDrawList *)CONCAT44(_x_00,_y),
                            (ImVec2 *)CONCAT44(_x,*(undefined4 *)(local_8 + 0xa0)),
                            (ImVec2 *)in_stack_ffffffffffffff80,(ImU32)in_stack_ffffffffffffff7c,
                            in_stack_ffffffffffffff78,(ImDrawCornerFlags)in_stack_ffffffffffffff74,
                            in_stack_ffffffffffffff70);
      }
      else if ((*(uint *)(local_8 + 4) & 0x400) == 0) {
        if ((*(uint *)(local_8 + 4) & 0x100) != 0) {
          ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff70,_x_00,_y);
          ImDrawList::AddLine((ImDrawList *)
                              CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                              (ImVec2 *)CONCAT44(in_stack_ffffffffffffff4c,fVar3),
                              (ImVec2 *)
                              CONCAT17(in_stack_ffffffffffffff47,
                                       CONCAT16(in_stack_ffffffffffffff46,
                                                CONCAT24(in_stack_ffffffffffffff44,
                                                         in_stack_ffffffffffffff40))),
                              in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
          ImVec2::ImVec2(&local_98,_x,fStack_68);
          ImDrawList::AddLine((ImDrawList *)
                              CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                              (ImVec2 *)CONCAT44(in_stack_ffffffffffffff4c,fVar3),
                              (ImVec2 *)
                              CONCAT17(in_stack_ffffffffffffff47,
                                       CONCAT16(in_stack_ffffffffffffff46,
                                                CONCAT24(in_stack_ffffffffffffff44,
                                                         in_stack_ffffffffffffff40))),
                              in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
        }
      }
      else {
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff80,_x,fStack_68);
        ImDrawList::AddLine((ImDrawList *)
                            CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                            (ImVec2 *)CONCAT44(in_stack_ffffffffffffff4c,fVar3),
                            (ImVec2 *)
                            CONCAT17(in_stack_ffffffffffffff47,
                                     CONCAT16(in_stack_ffffffffffffff46,
                                              CONCAT24(in_stack_ffffffffffffff44,
                                                       in_stack_ffffffffffffff40))),
                            in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff78,_x_00,_y);
        ImDrawList::AddLine((ImDrawList *)
                            CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                            (ImVec2 *)CONCAT44(in_stack_ffffffffffffff4c,fVar3),
                            (ImVec2 *)
                            CONCAT17(in_stack_ffffffffffffff47,
                                     CONCAT16(in_stack_ffffffffffffff46,
                                              CONCAT24(in_stack_ffffffffffffff44,
                                                       in_stack_ffffffffffffff40))),
                            in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
      }
    }
    if ((((*(uint *)(local_8 + 4) & 0x80) != 0) &&
        (*(float *)(local_8 + 0x80) < *(float *)(local_8 + 0xf8))) &&
       ((local_9c = *(float *)(local_8 + 0x80), *(float *)(local_8 + 0x130) <= local_9c &&
        (local_9c < *(float *)(local_8 + 0x138))))) {
      in_stack_fffffffffffffef0 = local_18;
      ImVec2::ImVec2(&local_a4,*(float *)(local_8 + 0xa8),local_9c);
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff54,*(float *)(local_8 + 0xac),local_9c);
      ImDrawList::AddLine((ImDrawList *)
                          CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                          (ImVec2 *)CONCAT44(in_stack_ffffffffffffff4c,fVar3),
                          (ImVec2 *)
                          CONCAT17(in_stack_ffffffffffffff47,
                                   CONCAT16(in_stack_ffffffffffffff46,
                                            CONCAT24(in_stack_ffffffffffffff44,
                                                     in_stack_ffffffffffffff40))),
                          in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38);
    }
    ImDrawList::PopClipRect(in_stack_fffffffffffffef0);
  }
  return;
}

Assistant:

void ImGui::TableDrawBorders(ImGuiTable* table)
{
    ImGuiWindow* inner_window = table->InnerWindow;
    if (!table->OuterWindow->ClipRect.Overlaps(table->OuterRect))
        return;

    ImDrawList* inner_drawlist = inner_window->DrawList;
    table->DrawSplitter.SetCurrentChannel(inner_drawlist, TABLE_DRAW_CHANNEL_BG0);
    inner_drawlist->PushClipRect(table->Bg0ClipRectForDrawCmd.Min, table->Bg0ClipRectForDrawCmd.Max, false);

    // Draw inner border and resizing feedback
    const float border_size = TABLE_BORDER_SIZE;
    const float draw_y1 = table->InnerRect.Min.y;
    const float draw_y2_body = table->InnerRect.Max.y;
    const float draw_y2_head = table->IsUsingHeaders ? ImMin(table->InnerRect.Max.y, (table->FreezeRowsCount >= 1 ? table->InnerRect.Min.y : table->WorkRect.Min.y) + table->LastFirstRowHeight) : draw_y1;
    if (table->Flags & ImGuiTableFlags_BordersInnerV)
    {
        for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
        {
            if (!(table->EnabledMaskByDisplayOrder & ((ImU64)1 << order_n)))
                continue;

            const int column_n = table->DisplayOrderToIndex[order_n];
            ImGuiTableColumn* column = &table->Columns[column_n];
            const bool is_hovered = (table->HoveredColumnBorder == column_n);
            const bool is_resized = (table->ResizedColumn == column_n) && (table->InstanceInteracted == table->InstanceCurrent);
            const bool is_resizable = (column->Flags & (ImGuiTableColumnFlags_NoResize | ImGuiTableColumnFlags_NoDirectResize_)) == 0;
            const bool is_frozen_separator = (table->FreezeColumnsCount != -1 && table->FreezeColumnsCount == order_n + 1);
            if (column->MaxX > table->InnerClipRect.Max.x && !is_resized)
                continue;

            // Decide whether right-most column is visible
            if (column->NextEnabledColumn == -1 && !is_resizable)
                if ((table->Flags & ImGuiTableFlags_SizingMask_) != ImGuiTableFlags_SizingFixedSame || (table->Flags & ImGuiTableFlags_NoHostExtendX))
                    continue;
            if (column->MaxX <= column->ClipRect.Min.x) // FIXME-TABLE FIXME-STYLE: Assume BorderSize==1, this is problematic if we want to increase the border size..
                continue;

            // Draw in outer window so right-most column won't be clipped
            // Always draw full height border when being resized/hovered, or on the delimitation of frozen column scrolling.
            ImU32 col;
            float draw_y2;
            if (is_hovered || is_resized || is_frozen_separator)
            {
                draw_y2 = draw_y2_body;
                col = is_resized ? GetColorU32(ImGuiCol_SeparatorActive) : is_hovered ? GetColorU32(ImGuiCol_SeparatorHovered) : table->BorderColorStrong;
            }
            else
            {
                draw_y2 = (table->Flags & (ImGuiTableFlags_NoBordersInBody | ImGuiTableFlags_NoBordersInBodyUntilResize)) ? draw_y2_head : draw_y2_body;
                col = (table->Flags & (ImGuiTableFlags_NoBordersInBody | ImGuiTableFlags_NoBordersInBodyUntilResize)) ? table->BorderColorStrong : table->BorderColorLight;
            }

            if (draw_y2 > draw_y1)
                inner_drawlist->AddLine(ImVec2(column->MaxX, draw_y1), ImVec2(column->MaxX, draw_y2), col, border_size);
        }
    }

    // Draw outer border
    // FIXME: could use AddRect or explicit VLine/HLine helper?
    if (table->Flags & ImGuiTableFlags_BordersOuter)
    {
        // Display outer border offset by 1 which is a simple way to display it without adding an extra draw call
        // (Without the offset, in outer_window it would be rendered behind cells, because child windows are above their
        // parent. In inner_window, it won't reach out over scrollbars. Another weird solution would be to display part
        // of it in inner window, and the part that's over scrollbars in the outer window..)
        // Either solution currently won't allow us to use a larger border size: the border would clipped.
        const ImRect outer_border = table->OuterRect;
        const ImU32 outer_col = table->BorderColorStrong;
        if ((table->Flags & ImGuiTableFlags_BordersOuter) == ImGuiTableFlags_BordersOuter)
        {
            inner_drawlist->AddRect(outer_border.Min, outer_border.Max, outer_col, 0.0f, ~0, border_size);
        }
        else if (table->Flags & ImGuiTableFlags_BordersOuterV)
        {
            inner_drawlist->AddLine(outer_border.Min, ImVec2(outer_border.Min.x, outer_border.Max.y), outer_col, border_size);
            inner_drawlist->AddLine(ImVec2(outer_border.Max.x, outer_border.Min.y), outer_border.Max, outer_col, border_size);
        }
        else if (table->Flags & ImGuiTableFlags_BordersOuterH)
        {
            inner_drawlist->AddLine(outer_border.Min, ImVec2(outer_border.Max.x, outer_border.Min.y), outer_col, border_size);
            inner_drawlist->AddLine(ImVec2(outer_border.Min.x, outer_border.Max.y), outer_border.Max, outer_col, border_size);
        }
    }
    if ((table->Flags & ImGuiTableFlags_BordersInnerH) && table->RowPosY2 < table->OuterRect.Max.y)
    {
        // Draw bottom-most row border
        const float border_y = table->RowPosY2;
        if (border_y >= table->BgClipRect.Min.y && border_y < table->BgClipRect.Max.y)
            inner_drawlist->AddLine(ImVec2(table->BorderX1, border_y), ImVec2(table->BorderX2, border_y), table->BorderColorLight, border_size);
    }

    inner_drawlist->PopClipRect();
}